

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

shared_ptr<AssemblyCode::AssemblyCommand> createStore(CTemp *source,int offset,CTemp *beginSP)

{
  CTemp *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<AssemblyCode::AssemblyCommand> sVar1;
  undefined1 local_2d;
  int local_2c;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_2c = -(int)beginSP;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<AssemblyCode::MoveRegToMemByRegPlusConst,std::allocator<AssemblyCode::MoveRegToMemByRegPlusConst>,IRT::CTemp&,int,IRT::CTemp&>
            (a_Stack_20,(MoveRegToMemByRegPlusConst **)&local_28,
             (allocator<AssemblyCode::MoveRegToMemByRegPlusConst> *)&local_2d,in_RCX,&local_2c,
             (CTemp *)CONCAT44(in_register_00000034,offset));
  (source->name)._M_dataplus._M_p = local_28._M_p;
  (source->name)._M_string_length = (size_type)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)source;
  return (shared_ptr<AssemblyCode::AssemblyCommand>)
         sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssemblyCode::AssemblyCommand> createStore(IRT::CTemp& source, int offset, IRT::CTemp& beginSP) {
    return std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>(beginSP, -offset, source);
}